

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall
helics::CommonCore::getSourceTargets_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  uchar uVar1;
  _Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *p_Var2;
  FederateState *pFVar3;
  InputInfo *this_00;
  string *psVar4;
  EndpointInfo *this_01;
  
  p_Var2 = getHandleInfo(this,handle);
  if (p_Var2 != (_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)0x0) {
    uVar1 = (p_Var2->
            super__Hash_node_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ).
            super__Hash_node_value_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_storage._M_storage.__data[4];
    if ((uVar1 == 'e') || (uVar1 == 's')) {
      pFVar3 = getFederateAt(this,(LocalFederateId)
                                  *(BaseType *)
                                   &(p_Var2->
                                    super__Hash_node_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    ).
                                    super__Hash_node_value_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_storage._M_storage);
      this_01 = InterfaceInfo::getEndpoint(&pFVar3->interfaceInformation,handle);
      if (this_01 != (EndpointInfo *)0x0) {
        psVar4 = EndpointInfo::getSourceTargets_abi_cxx11_(this_01);
        return psVar4;
      }
    }
    else if (uVar1 == 'i') {
      pFVar3 = getFederateAt(this,(LocalFederateId)
                                  *(BaseType *)
                                   &(p_Var2->
                                    super__Hash_node_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    ).
                                    super__Hash_node_value_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_storage._M_storage);
      this_00 = InterfaceInfo::getInput(&pFVar3->interfaceInformation,handle);
      if (this_00 != (InputInfo *)0x0) {
        psVar4 = InputInfo::getTargets_abi_cxx11_(this_00);
        return psVar4;
      }
    }
  }
  return (string *)&gEmptyString_abi_cxx11_;
}

Assistant:

const std::string& CommonCore::getSourceTargets(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getTargets();
                }
                break;
            }
            case InterfaceType::PUBLICATION:
                return gEmptyString;
            case InterfaceType::ENDPOINT:
            case InterfaceType::SINK: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* eptInfo = fed->interfaces().getEndpoint(handle);
                if (eptInfo != nullptr) {
                    return eptInfo->getSourceTargets();
                }
                break;
            }
            case InterfaceType::FILTER: {
                break;
            }
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}